

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcb.c
# Opt level: O2

int envy_bios_parse_rdcb(envy_bios *bios)

{
  uint8_t *res;
  byte bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  undefined8 in_RAX;
  long lVar6;
  uint8_t tv1;
  uint8_t tv0;
  undefined2 uVar7;
  
  uVar7 = (undefined2)((ulong)in_RAX >> 0x38);
  res = &(bios->dcb).rdcb_version;
  iVar2 = bios_u8(bios,(bios->dcb).offset - 1,res);
  if (iVar2 == 0) {
    bVar1 = *res;
    uVar3 = bVar1 - 0x11;
    if ((6 < (byte)uVar3) || ((0x71U >> (uVar3 & 0x1f) & 1) == 0)) {
      fprintf(_stderr,"Unknown RDCB table version %d.%d\n",(ulong)(bVar1 >> 4),(ulong)(bVar1 & 0xf))
      ;
      return -0x16;
    }
    (bios->dcb).rdcb_len = *(uint16_t *)(&DAT_00268e24 + (ulong)(uVar3 & 0xff) * 2);
    uVar3 = bios_u16(bios,(bios->dcb).offset - 3,&(bios->inputdev).offset);
    uVar4 = bios_u8(bios,(bios->dcb).offset - 5,&tv0);
    _tv1 = uVar7;
    uVar5 = bios_u8(bios,(bios->dcb).offset - 4,&tv1);
    uVar5 = uVar5 | uVar4 | uVar3;
    (bios->dcb).tvdac0_present = tv0 & 1;
    (bios->dcb).tvdac0_neg = tv0 >> 1 & 1;
    (bios->dcb).tvdac0_line = tv1 >> 4;
    (bios->dcb).rdcb_unk04_0 = tv1 & 0xf;
    (bios->dcb).rdcb_unk05_2 = tv0 >> 2;
    iVar2 = -6;
    for (lVar6 = 0x169; lVar6 != 0x170; lVar6 = lVar6 + 1) {
      uVar3 = bios_u8(bios,(uint)(bios->dcb).offset + iVar2,(uint8_t *)((long)&bios->data + lVar6));
      uVar5 = uVar5 | uVar3;
      iVar2 = iVar2 + -1;
    }
    if (0x14 < *res) {
      uVar3 = bios_u8(bios,(bios->dcb).offset - 0xd,&(bios->dcb).rdcb_unk0d);
      uVar4 = bios_u16(bios,(bios->dcb).offset - 0xf,&(bios->gpio).offset);
      uVar5 = uVar5 | uVar4 | uVar3;
      iVar2 = -0x10;
      for (lVar6 = 0x171; lVar6 != 0x17a; lVar6 = lVar6 + 1) {
        uVar3 = bios_u8(bios,(uint)(bios->dcb).offset + iVar2,(uint8_t *)((long)&bios->data + lVar6)
                       );
        uVar5 = uVar5 | uVar3;
        iVar2 = iVar2 + -1;
      }
      if (0x16 < *res) {
        iVar2 = -0x19;
        for (lVar6 = 0x17a; lVar6 != 0x17e; lVar6 = lVar6 + 1) {
          uVar3 = bios_u8(bios,(uint)(bios->dcb).offset + iVar2,
                          (uint8_t *)((long)&bios->data + lVar6));
          uVar5 = uVar5 | uVar3;
          iVar2 = iVar2 + -1;
        }
      }
    }
    if (uVar5 == 0) {
      uVar3 = (uint)(bios->dcb).rdcb_len;
      envy_bios_block(bios,(bios->dcb).offset - uVar3,uVar3,"RDCB",-1);
      if ((bios->dcb).rdcb_version < 0x16) {
        uVar3 = ((uint)(bios->dcb).offset - (uint)(bios->dcb).rdcb_len) - 0x80;
        bios->odcb_offset = uVar3;
        envy_bios_block(bios,uVar3,0x80,"ODCB",-1);
      }
      (bios->dcb).rdcb_valid = '\x01';
      return 0;
    }
  }
  return -0xe;
}

Assistant:

int envy_bios_parse_rdcb (struct envy_bios *bios) {
	struct envy_bios_dcb *dcb = &bios->dcb;
	int err = 0;
	err |= bios_u8(bios, dcb->offset - 1, &dcb->rdcb_version);
	if (err)
		return -EFAULT;
	switch (dcb->rdcb_version) {
		case 0x11:
			dcb->rdcb_len = 0xc;
			break;
		case 0x15:
		case 0x16:
			dcb->rdcb_len = 0x18;
			break;
		case 0x17:
			dcb->rdcb_len = 0x1c;
			break;
		default:
			ENVY_BIOS_ERR("Unknown RDCB table version %d.%d\n", dcb->rdcb_version >> 4, dcb->rdcb_version & 0xf);
			return -EINVAL;
	}
	err |= bios_u16(bios, dcb->offset - 3, &bios->inputdev.offset);
	uint8_t tv0, tv1;
	int j;
	err |= bios_u8(bios, dcb->offset - 5, &tv0);
	err |= bios_u8(bios, dcb->offset - 4, &tv1);
	dcb->tvdac0_present = tv0 & 1;
	dcb->tvdac0_neg = tv0 >> 1 & 1;
	dcb->tvdac0_line = tv1 >> 4;
	dcb->rdcb_unk04_0 = tv1 & 0xf;
	dcb->rdcb_unk05_2 = tv0 >> 2;
	for (j = 0; j < 7; j++)
		err |= bios_u8(bios, dcb->offset - 6 - j, &dcb->rdcb_unk06[j]);
	if (dcb->rdcb_version >= 0x15) {
		err |= bios_u8(bios, dcb->offset - 13, &dcb->rdcb_unk0d);
		err |= bios_u16(bios, dcb->offset - 15, &bios->gpio.offset);
		for (j = 0; j < 9; j++)
			err |= bios_u8(bios, dcb->offset - 16 - j, &dcb->rdcb_unk10[j]);
	}
	if (dcb->rdcb_version >= 0x17) {
		for (j = 9; j < 13; j++)
			err |= bios_u8(bios, dcb->offset - 16 - j, &dcb->rdcb_unk10[j]);
	}
	if (err)
		return -EFAULT;
	envy_bios_block(bios, dcb->offset - dcb->rdcb_len, dcb->rdcb_len, "RDCB", -1);
	if (dcb->rdcb_version < 0x16) {
		bios->odcb_offset = dcb->offset - dcb->rdcb_len - 0x80;
		envy_bios_block(bios, bios->odcb_offset, 0x80, "ODCB", -1);
	}
	dcb->rdcb_valid = 1;
	return 0;
}